

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_socket.c
# Opt level: O2

int check_wsz(skynet_context *ctx,int id,void *buffer,int64_t wsz)

{
  uint32_t destination;
  int iVar1;
  skynet_socket_message tmp;
  
  if ((long)buffer < 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (&Elf64_Ehdr_00100000 < buffer) {
      tmp.type = 7;
      tmp.ud = (int)((ulong)buffer >> 10);
      tmp.buffer = (char *)0x0;
      tmp.id = id;
      destination = skynet_context_handle(ctx);
      iVar1 = 0;
      skynet_send(ctx,0,destination,6,0,&tmp,0x18);
    }
  }
  return iVar1;
}

Assistant:

static int
check_wsz(struct skynet_context *ctx, int id, void *buffer, int64_t wsz) {
	if (wsz < 0) {
		return -1;
	} else if (wsz > 1024 * 1024) {
		struct skynet_socket_message tmp;
		tmp.type = SKYNET_SOCKET_TYPE_WARNING;
		tmp.id = id;
		tmp.ud = (int)(wsz / 1024);
		tmp.buffer = NULL;
		skynet_send(ctx, 0, skynet_context_handle(ctx), PTYPE_SOCKET, 0 , &tmp, sizeof(tmp));
//		skynet_error(ctx, "%d Mb bytes on socket %d need to send out", (int)(wsz / (1024 * 1024)), id);
	}
	return 0;
}